

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O2

UBool icu_63::PatternProps::isWhiteSpace(UChar32 c)

{
  if (-1 < c) {
    if ((uint)c < 0x100) {
      return (byte)latin1[(uint)c] >> 2 & 1;
    }
    if (c - 0x200eU < 0x1c) {
      return c - 0x2028U < 0xffffffe8;
    }
  }
  return '\0';
}

Assistant:

UBool
PatternProps::isWhiteSpace(UChar32 c) {
    if(c<0) {
        return FALSE;
    } else if(c<=0xff) {
        return (UBool)(latin1[c]>>2)&1;
    } else if(0x200e<=c && c<=0x2029) {
        return c<=0x200f || 0x2028<=c;
    } else {
        return FALSE;
    }
}